

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

void __thiscall
QDirListingPrivate::checkAndPushDirectory(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  uint uVar1;
  bool bVar2;
  Filters *pFVar3;
  long in_FS_OFFSET;
  QStringView fileName;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
          super_QFlagsStorage<QDirListing::IteratorFlag>.i;
  if (((uVar1 >> 10 & 1) != 0) &&
     (((uVar1 >> 0xb & 1) != 0 || (bVar2 = QDirEntryInfo::isSymLink(entryInfo), !bVar2)))) {
    QDirEntryInfo::fileName(&local_40,entryInfo);
    fileName.m_data = local_40.d.ptr;
    fileName.m_size = local_40.d.size;
    bVar2 = isDotOrDotDot(fileName);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (!bVar2) {
      pFVar3 = (Filters *)&this->iteratorFlags;
      uVar1 = 0x40;
      if (this->useLegacyFilters != false) {
        pFVar3 = &this->legacyDirFilters;
        uVar1 = 0x500;
      }
      if ((((((QFlagsStorage<QDirListing::IteratorFlag> *)
             &(pFVar3->super_QFlagsStorageHelper<QDir::Filter,_4>).super_QFlagsStorage<QDir::Filter>
             )->i & uVar1) != 0) || (bVar2 = QDirEntryInfo::isHidden(entryInfo), !bVar2)) &&
         (bVar2 = QDirEntryInfo::isDir(entryInfo), bVar2)) {
        pushDirectory(this,entryInfo);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDirListingPrivate::checkAndPushDirectory(QDirEntryInfo &entryInfo)
{
    using F = QDirListing::IteratorFlag;
    // If we're doing flat iteration, we're done.
    if (!iteratorFlags.testAnyFlags(F::Recursive))
        return;

    // Follow symlinks only when asked
    if (!iteratorFlags.testAnyFlags(F::FollowDirSymlinks) && entryInfo.isSymLink())
        return;

    // Never follow . and ..
    if (isDotOrDotDot(entryInfo.fileName()))
        return;

    // No hidden directories unless requested
    const bool includeHidden = [this]() {
        if (useLegacyFilters)
            return legacyDirFilters.testAnyFlags(QDir::AllDirs | QDir::Hidden);
        return iteratorFlags.testAnyFlags(QDirListing::IteratorFlag::IncludeHidden);
    }();
    if (!includeHidden && entryInfo.isHidden())
        return;

    // Never follow non-directory entries
    if (!entryInfo.isDir())
        return;

    pushDirectory(entryInfo);
}